

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderBarrier.cpp
# Opt level: O1

char * __thiscall glcts::TessellationShaderBarrier1::getTESCode(TessellationShaderBarrier1 *this)

{
  return 
  "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout(isolines, point_mode) in;\n\nin ivec4 test_vector2[];\n\nout ivec4 result_vector2;\n\nvoid main()\n{\n    int base = gl_PrimitiveID * 4;\n\n    if (test_vector2[0].x == (base + 1) && test_vector2[0].y == (base + 2) && test_vector2[0].z == (base + 3) && test_vector2[0].w == (base + 0)  &&\n        test_vector2[1].x == (base + 2) && test_vector2[1].y == (base + 3) && test_vector2[1].z == (base + 4) && test_vector2[1].w == (base + 0)  &&\n        test_vector2[2].x == (base + 3) && test_vector2[2].y == (base + 4) && test_vector2[2].z == (base + 5) && test_vector2[2].w == (base + 0)  &&\n        test_vector2[3].x == (base + 0) && test_vector2[3].y == (base + 1) && test_vector2[3].z == (base + 2) && test_vector2[3].w == (base + 0) )\n    {\n        result_vector2 = ivec4(1);\n    }\n    else\n    {\n        result_vector2 = ivec4(0);\n    }\n}\n"
  ;
}

Assistant:

const char* TessellationShaderBarrier1::getTESCode()
{
	static const char* tes_code = "${VERSION}\n"
								  "\n"
								  "${TESSELLATION_SHADER_REQUIRE}\n"
								  "\n"
								  "layout(isolines, point_mode) in;\n"
								  "\n"
								  "in ivec4 test_vector2[];\n"
								  "\n"
								  "out ivec4 result_vector2;\n"
								  "\n"
								  "void main()\n"
								  "{\n"
								  "    int base = gl_PrimitiveID * 4;\n"
								  "\n"
								  "    if (test_vector2[0].x == (base + 1) && test_vector2[0].y == (base + 2) && "
								  "test_vector2[0].z == (base + 3) && test_vector2[0].w == (base + 0)  &&\n"
								  "        test_vector2[1].x == (base + 2) && test_vector2[1].y == (base + 3) && "
								  "test_vector2[1].z == (base + 4) && test_vector2[1].w == (base + 0)  &&\n"
								  "        test_vector2[2].x == (base + 3) && test_vector2[2].y == (base + 4) && "
								  "test_vector2[2].z == (base + 5) && test_vector2[2].w == (base + 0)  &&\n"
								  "        test_vector2[3].x == (base + 0) && test_vector2[3].y == (base + 1) && "
								  "test_vector2[3].z == (base + 2) && test_vector2[3].w == (base + 0) )\n"
								  "    {\n"
								  "        result_vector2 = ivec4(1);\n"
								  "    }\n"
								  "    else\n"
								  "    {\n"
								  "        result_vector2 = ivec4(0);\n"
								  "    }\n"
								  "}\n";

	return tes_code;
}